

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGenericPoolAllocator.cpp
# Opt level: O2

void * __thiscall cbtGenericMemoryPool::allocate(cbtGenericMemoryPool *this,size_t size_bytes)

{
  size_t sVar1;
  size_t num_elements;
  
  num_elements = (size_bytes / *(ulong *)(this + 0x28) + 1) -
                 (ulong)(size_bytes % *(ulong *)(this + 0x28) == 0);
  sVar1 = allocate_from_free_nodes(this,num_elements);
  if ((sVar1 == 0xffffffff) && (sVar1 = allocate_from_pool(this,num_elements), sVar1 == 0xffffffff))
  {
    return (void *)0x0;
  }
  return (void *)(sVar1 * *(long *)(this + 0x28) + *(long *)this);
}

Assistant:

void *cbtGenericMemoryPool::allocate(size_t size_bytes)
{
	size_t module = size_bytes % m_element_size;
	size_t element_count = size_bytes / m_element_size;
	if (module > 0) element_count++;

	size_t alloc_pos = allocate_from_free_nodes(element_count);
	// a free node is found
	if (alloc_pos != BT_UINT_MAX)
	{
		return get_element_data(alloc_pos);
	}
	// allocate directly on pool
	alloc_pos = allocate_from_pool(element_count);

	if (alloc_pos == BT_UINT_MAX) return NULL;  // not space
	return get_element_data(alloc_pos);
}